

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::lts_20240722::SimpleAtod(lts_20240722 *this,string_view str,Nonnull<double_*> out)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  double *value;
  Nonnull<const_char_*> first;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  string_view sVar8;
  from_chars_result fVar9;
  
  value = (double *)str._M_str;
  *value = 0.0;
  sVar8 = StripLeadingAsciiWhitespace(this,str);
  first = sVar8._M_str;
  uVar2 = sVar8._M_len;
  pcVar3 = first + uVar2;
  pcVar5 = pcVar3;
  if (0 < (long)uVar2 >> 2) {
    pcVar5 = first + ((uint)sVar8._M_len & 3);
    lVar4 = ((long)uVar2 >> 2) + 1;
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-1]] & 8) == 0) goto LAB_0010d242;
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-2]] & 8) == 0) {
        pcVar3 = pcVar3 + -1;
        goto LAB_0010d242;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-3]] & 8) == 0) {
        pcVar3 = pcVar3 + -2;
        goto LAB_0010d242;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar3[-4]] & 8) == 0) {
        pcVar3 = pcVar3 + -3;
        goto LAB_0010d242;
      }
      pcVar3 = pcVar3 + -4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)pcVar5 - (long)first;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar3 = first;
      if ((lVar4 != 3) ||
         (pcVar3 = pcVar5, ((&ascii_internal::kPropertyBits)[(byte)pcVar5[-1]] & 8) == 0))
      goto LAB_0010d242;
      pcVar5 = pcVar5 + -1;
    }
    pcVar3 = pcVar5;
    if (((&ascii_internal::kPropertyBits)[(byte)pcVar5[-1]] & 8) == 0) goto LAB_0010d242;
    pcVar5 = pcVar5 + -1;
  }
  pcVar3 = pcVar5;
  if (((&ascii_internal::kPropertyBits)[(byte)pcVar5[-1]] & 8) != 0) {
    pcVar3 = first;
  }
LAB_0010d242:
  uVar6 = (long)pcVar3 - (long)first;
  if (uVar2 < (ulong)((long)pcVar3 - (long)first)) {
    uVar6 = uVar2;
  }
  if ((uVar6 != 0) && (*first == '+')) {
    first = first + 1;
    uVar6 = uVar6 - 1;
    if ((uVar6 != 0) && (*first == '-')) {
      return false;
    }
  }
  fVar9 = from_chars(first,first + uVar6,value,general);
  bVar1 = false;
  if (((fVar9.ec != invalid_argument) && (bVar1 = false, fVar9.ptr == first + uVar6)) &&
     (bVar1 = true, fVar9.ec == result_out_of_range)) {
    if (*value <= 1.0) {
      if (-1.0 <= *value) {
        return true;
      }
      dVar7 = -INFINITY;
    }
    else {
      dVar7 = INFINITY;
    }
    *value = dVar7;
  }
  return bVar1;
}

Assistant:

bool SimpleAtod(absl::string_view str, absl::Nonnull<double*> out) {
  *out = 0.0;
  str = StripAsciiWhitespace(str);
  // std::from_chars doesn't accept an initial +, but SimpleAtod does, so if one
  // is present, skip it, while avoiding accepting "+-0" as valid.
  if (!str.empty() && str[0] == '+') {
    str.remove_prefix(1);
    if (!str.empty() && str[0] == '-') {
      return false;
    }
  }
  auto result = absl::from_chars(str.data(), str.data() + str.size(), *out);
  if (result.ec == std::errc::invalid_argument) {
    return false;
  }
  if (result.ptr != str.data() + str.size()) {
    // not all non-whitespace characters consumed
    return false;
  }
  // from_chars() with DR 3081's current wording will return max() on
  // overflow.  SimpleAtod returns infinity instead.
  if (result.ec == std::errc::result_out_of_range) {
    if (*out > 1.0) {
      *out = std::numeric_limits<double>::infinity();
    } else if (*out < -1.0) {
      *out = -std::numeric_limits<double>::infinity();
    }
  }
  return true;
}